

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlGlyphDefn.h
# Opt level: O1

void __thiscall GdlGlyphDefn::GdlGlyphDefn(GdlGlyphDefn *this,GlyphType glft,string *sta)

{
  pointer pcVar1;
  
  GdlObject::GdlObject(&(this->super_GdlGlyphClassMember).super_GdlDefn.super_GdlObject);
  (this->super_GdlGlyphClassMember).m_fIsSpaceGlyph = -1;
  (this->super_GdlGlyphClassMember).super_GdlDefn._vptr_GdlDefn =
       (_func_int **)&PTR__GdlGlyphDefn_00241c30;
  *(GlyphType *)&(this->super_GdlGlyphClassMember).field_0x34 = glft;
  this->m_nFirst = 0;
  this->m_nLast = 0;
  this->m_wCodePage = 0;
  this->m_nUnicodeInput = 0;
  this->m_pglfOutput = (GdlGlyphDefn *)0x0;
  (this->m_sta)._M_dataplus._M_p = (pointer)&(this->m_sta).field_2;
  pcVar1 = (sta->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_sta,pcVar1,pcVar1 + sta->_M_string_length);
  (this->m_vwGlyphIDs).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vwGlyphIDs).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vwGlyphIDs).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vgbdy).super__Vector_base<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vgbdy).super__Vector_base<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_vgbdy).super__Vector_base<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_vgbdy).super__Vector_base<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  return;
}

Assistant:

GdlGlyphDefn(GlyphType glft, std::string sta)
		:	GdlGlyphClassMember(),
			m_glft(glft),
			m_nFirst(0),
			m_nLast(0),
			m_wCodePage(0),
			m_nUnicodeInput(0),
			m_pglfOutput(NULL),
			m_sta(sta),
			m_fGAResolved(false)
	{
		Assert(m_glft == kglftPostscript);
	}